

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_tail_prep(ASMState *as)

{
  int iVar1;
  uint local_1c;
  MCode *pMStack_18;
  int i;
  MCode *p;
  ASMState *as_local;
  
  if (as->realign == (MCode *)0x0) {
    pMStack_18 = as->mctop + -5;
  }
  else {
    local_1c = (uint)as->realign & 0xf;
    pMStack_18 = as->mctop;
    while (0 < (int)local_1c) {
      pMStack_18[-1] = 0x90;
      local_1c = local_1c - 1;
      pMStack_18 = pMStack_18 + -1;
    }
    as->mctop = pMStack_18;
    iVar1 = 2;
    if (as->loopinv != 0) {
      iVar1 = 5;
    }
    pMStack_18 = pMStack_18 + -(long)iVar1;
  }
  if (as->loopref == 0) {
    as->mcp = pMStack_18 + -7;
    as->invmcp = (MCode *)0x0;
  }
  else {
    as->mcp = pMStack_18;
    as->invmcp = pMStack_18;
  }
  return;
}

Assistant:

static void asm_tail_prep(ASMState *as)
{
  MCode *p = as->mctop;
  /* Realign and leave room for backwards loop branch or exit branch. */
  if (as->realign) {
    int i = ((int)(intptr_t)as->realign) & 15;
    /* Fill unused mcode tail with NOPs to make the prefetcher happy. */
    while (i-- > 0)
      *--p = XI_NOP;
    as->mctop = p;
    p -= (as->loopinv ? 5 : 2);  /* Space for short/near jmp. */
  } else {
    p -= 5;  /* Space for exit branch (near jmp). */
  }
  if (as->loopref) {
    as->invmcp = as->mcp = p;
  } else {
    /* Leave room for ESP adjustment: add esp, imm or lea esp, [esp+imm] */
    as->mcp = p - (LJ_64 ? 7 : 6);
    as->invmcp = NULL;
  }
}